

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O2

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  double dVar2;
  int iVar3;
  DEV_DATA info;
  long lVar4;
  INT32 *pIVar5;
  INT32 (*paIVar6) [256];
  UINT8 UVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  INT32 (*paIVar12) [256];
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  info.chipInf = calloc(1,0x22d8);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar7 = 0xff;
  }
  else {
    fVar15 = (float)cfg->clock / 180.0;
    *(float *)((long)info.chipInf + 0x10bc) = fVar15;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar14 = 0;
      for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
        dVar1 = pow(10.0,(double)(((float)(int)lVar4 * -24.0 * 0.015625) / 20.0));
        uVar11 = 0x10;
        lVar13 = lVar14;
        for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
          iVar3 = (int)uVar8;
          if (iVar3 == 8) {
            fVar16 = 0.0;
            fVar17 = 0.0;
          }
          else if (iVar3 == 0) {
            fVar17 = 1.0;
            fVar16 = 1.0;
          }
          else if (uVar8 < 8) {
            dVar2 = pow(10.0,(double)(((float)iVar3 * -12.0 * 0.25) / 20.0));
            fVar17 = 0.0;
            if (uVar8 != 7) {
              fVar17 = (float)dVar2;
            }
            fVar16 = 1.0;
          }
          else {
            dVar2 = pow(10.0,(double)(((float)(int)uVar11 * -12.0 * 0.25) / 20.0));
            fVar16 = 0.0;
            if ((~uVar11 & 7) != 0) {
              fVar16 = (float)dVar2;
            }
            fVar17 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar13) =
               (int)(long)(fVar17 * (float)dVar1 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar13) =
               (int)(long)(fVar16 * (float)dVar1 * 0.25 * 4096.0);
          uVar11 = uVar11 - 1;
          lVar13 = lVar13 + 0x200;
        }
        lVar14 = lVar14 + 4;
      }
      pIVar5 = linear_to_exp_volume;
      for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
        dVar1 = pow(10.0,(double)(((float)(int)lVar4 * 96.0 * -0.0009765625 + 96.0) / -20.0));
        *pIVar5 = (INT32)(long)((float)dVar1 * 4096.0);
        pIVar5 = pIVar5 + 1;
      }
      iVar3 = 0xff;
      lVar14 = 0;
      uVar8 = 0;
      for (lVar4 = -0x200; lVar4 != 0; lVar4 = lVar4 + 2) {
        iVar9 = (int)lVar4;
        if (uVar8 < 0x40) {
          iVar9 = iVar9 + 0x280;
LAB_001577f9:
          *(int *)((long)pitch_table + lVar14) = iVar9;
          *(int *)((long)amplitude_table + lVar14) = iVar3;
        }
        else {
          if (uVar8 < 0x80) {
            iVar9 = iVar3 + 0x80;
            goto LAB_001577f9;
          }
          iVar10 = iVar9;
          if (uVar8 < 0xc0) {
            iVar10 = iVar3;
          }
          *(int *)((long)pitch_table + lVar14) = iVar10 + 0x81;
          *(int *)((long)amplitude_table + lVar14) = iVar9 + 0x100;
        }
        uVar8 = uVar8 + 1;
        iVar3 = iVar3 + -2;
        lVar14 = lVar14 + 4;
      }
      paIVar6 = pitch_scale_tables;
      paIVar12 = amplitude_scale_tables;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
        fVar16 = PHASE_SCALE_LIMIT[lVar4];
        for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
          dVar1 = exp2((double)(((float)((int)lVar14 + -0x80) * fVar16 * 0.0078125) / 1200.0));
          (*paIVar6)[lVar14] = (INT32)(long)((float)dVar1 * 256.0);
        }
        fVar16 = AMPLITUDE_SCALE_LIMIT[lVar4];
        for (lVar14 = 0; lVar14 != 0x100; lVar14 = lVar14 + 1) {
          dVar1 = pow(10.0,(double)(((float)(int)lVar14 * -fVar16 * 0.00390625) / 20.0));
          (*paIVar12)[lVar14] = (INT32)(long)((float)dVar1 * 256.0);
        }
        paIVar6 = paIVar6 + 1;
        paIVar12 = paIVar12 + 1;
      }
    }
    for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
      *(int *)((long)info.chipInf + lVar4 * 4 + 0x12c0) =
           (int)(long)(((float)(int)lVar4 + 1024.0) * fVar15 * 0.0009765625 * 4096.0);
    }
    for (lVar4 = 0; lVar4 != 0x3c; lVar4 = lVar4 + 1) {
      dVar1 = BASE_TIMES[lVar4 + 4];
      *(int *)((long)info.chipInf + lVar4 * 4 + 0x10d0) =
           (int)(long)(67108864.0 / (float)((dVar1 * 44100.0) / 1000.0));
      *(int *)((long)info.chipInf + lVar4 * 4 + 0x11d0) =
           (int)(long)(67108864.0 / (float)((dVar1 * 14.32833 * 44100.0) / 1000.0));
    }
    ((DEV_DATA *)((long)info.chipInf + 0x10c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x10c8))->chipInf = (void *)0x0;
    *(undefined4 *)((long)info.chipInf + 0x11bc) = 0x4000000;
    ((DEV_DATA *)((long)info.chipInf + 0x11c0))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x11c8))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x22c0))->chipInf = (void *)0x4cffffff68;
    *(undefined1 *)&((DEV_DATA *)((long)info.chipInf + 0x10b0))->chipInf = 0;
    *(undefined8 *)((long)info.chipInf + 0x10b4) = 0;
    UVar7 = '\0';
    multipcm_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    fVar15 = *(float *)((long)info.chipInf + 0x10bc);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar15;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar7;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
		INT32 level;

		IsInit = 1;

		// Volume + pan table
		for (level = 0; level < 0x80; ++level)
		{
			const float vol_db = (float)level * (-24.0f) / 64.0f;
			const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
			INT32 pan;

			for (pan = 0; pan < 0x10; ++pan)
			{
				float pan_left, pan_right;
				if (pan == 0x8)
				{
					pan_left = 0.0;
					pan_right = 0.0;
				}
				else if (pan == 0x0)
				{
					pan_left = 1.0;
					pan_right = 1.0;
				}
				else if (pan & 0x8)
				{
					const INT32 inverted_pan = 0x10 - pan;
					const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

					pan_left = 1.0;
					pan_right = powf(10.0f, pan_vol_db / 20.0f);

					if ((inverted_pan & 0x7) == 7)
						pan_right = 0.0;
				}
				else
				{
					const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

					pan_left = powf(10.0f, pan_vol_db / 20.0f);
					pan_right = 1.0;

					if ((pan & 0x7) == 7)
						pan_left = 0.0;
				}

				left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
				right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
			}
		}

		// build the linear->exponential ramps
		for(i = 0; i < 0x400; ++i)
		{
			const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
			const float exp_volume = powf(10.0f, db / 20.0f);
			linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
		}

		lfo_init();
	}

	//Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	for (i = 4; i < 0x40; ++i)
	{
		// Times are based on 44100Hz clock, adjust to real chip clock
		ptChip->attack_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * 44100.0 / 1000.0);
		ptChip->decay_release_step[i] = (float)(0x400 << EG_SHIFT) / (float)(BASE_TIMES[i] * attack_rate_to_decay_rate * 44100.0 / 1000.0);
	}
	ptChip->attack_step[0] = ptChip->attack_step[1] = ptChip->attack_step[2] = ptChip->attack_step[3] = 0;
	ptChip->attack_step[0x3f] = 0x400 << EG_SHIFT;
	ptChip->decay_release_step[0] = ptChip->decay_release_step[1] = ptChip->decay_release_step[2] = ptChip->decay_release_step[3] = 0;

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	ptChip->sega_banking = 0;
	ptChip->bank0 = ptChip->bank1 = 0x000000;

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}